

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int genHouseTower(PieceEnv *env,Piece *current,int depth)

{
  byte bVar1;
  Piece *pPVar2;
  ulong uVar3;
  int iVar4;
  uint rot;
  int iVar5;
  
  iVar4 = 0;
  if (depth < 9) {
    bVar1 = current->rot;
    rot = (uint)bVar1;
    pPVar2 = addEndCityPiece(env,current,rot,-3,env->y,-0xb,0);
    uVar3 = *env->rng;
    do {
      uVar3 = uVar3 * 0x5deece66d + 0xb & 0xffffffffffff;
      iVar4 = (int)(uVar3 >> 0x11);
      iVar5 = iVar4 + (int)((uVar3 >> 0x11) / 3) * -3;
    } while (-1 < (iVar5 - iVar4) + -3);
    *env->rng = uVar3;
    if (iVar5 == 0) {
      addEndCityPiece(env,pPVar2,(uint)bVar1,-1,4,-1,1);
    }
    else {
      pPVar2 = addEndCityPiece(env,pPVar2,rot,-1,0,-1,10);
      if (iVar5 == 1) {
        iVar4 = 0xb;
      }
      else {
        pPVar2 = addEndCityPiece(env,pPVar2,rot,-1,4,-1,0xe);
        iVar4 = 0xf;
      }
      pPVar2 = addEndCityPiece(env,pPVar2,rot,-1,8,-1,iVar4);
      genPiecesRecusively(genTower,env,pPVar2,depth + 1);
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static
int genHouseTower(PieceEnv *env, Piece *current, int depth)
{
    if (depth > 8) return 0;
    int rot = current->rot;
    Piece *base = current;
    base = addEndCityPiece(env, base, rot, -3, env->y, -11, BASE_FLOOR);
    int size = nextInt(env->rng, 3);
    if (size == 0)
    {
        addEndCityPiece(env, base, rot, -1, 4, -1, BASE_ROOF);
        return 1;
    }
    base = addEndCityPiece(env, base, rot, -1, 0, -1, SECOND_FLOOR_2);
    if (size == 1)
    {
        base = addEndCityPiece(env, base, rot, -1, 8, -1, SECOND_ROOF);
    }
    else
    {
        base = addEndCityPiece(env, base, rot, -1, 4, -1, THIRD_FLOOR_2);
        base = addEndCityPiece(env, base, rot, -1, 8, -1, THIRD_ROOF);
    }
    genPiecesRecusively(genTower, env, base, depth+1);
    return 1;
}